

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O0

void * zmq_socket(void *ctx_,int type_)

{
  bool bVar1;
  int *piVar2;
  socket_base_t *psVar3;
  ctx_t *in_RDI;
  socket_base_t *s;
  ctx_t *ctx;
  int in_stack_00000034;
  ctx_t *in_stack_00000038;
  
  if ((in_RDI != (ctx_t *)0x0) && (bVar1 = zmq::ctx_t::check_tag(in_RDI), bVar1)) {
    psVar3 = zmq::ctx_t::create_socket(in_stack_00000038,in_stack_00000034);
    return psVar3;
  }
  piVar2 = __errno_location();
  *piVar2 = 0xe;
  return (void *)0x0;
}

Assistant:

void *zmq_socket (void *ctx_, int type_)
{
    if (!ctx_ || !(static_cast<zmq::ctx_t *> (ctx_))->check_tag ()) {
        errno = EFAULT;
        return NULL;
    }
    zmq::ctx_t *ctx = static_cast<zmq::ctx_t *> (ctx_);
    zmq::socket_base_t *s = ctx->create_socket (type_);
    return static_cast<void *> (s);
}